

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath(cmLocalUnixMakefileGenerator3 *this)

{
  string *__lhs;
  bool bVar1;
  char *pcVar2;
  allocator local_59;
  string local_58;
  string local_38;
  
  pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_58,pcVar2,&local_59);
  cmOutputConverter::Convert
            (&local_38,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_58,HOME_OUTPUT,UNCHANGED);
  __lhs = &this->HomeRelativeOutputPath;
  std::__cxx11::string::operator=((string *)__lhs,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::operator==(__lhs,".");
  if (bVar1) {
    std::__cxx11::string::assign((char *)__lhs);
  }
  if ((this->HomeRelativeOutputPath)._M_string_length != 0) {
    std::__cxx11::string::append((char *)__lhs);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath =
    this->Convert(this->GetCurrentBinaryDirectory(), HOME_OUTPUT);
  if(this->HomeRelativeOutputPath == ".")
    {
    this->HomeRelativeOutputPath = "";
    }
  if(!this->HomeRelativeOutputPath.empty())
    {
    this->HomeRelativeOutputPath += "/";
    }
}